

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzDDD::ArchiveOUT(ChNodeFEAxyzDDD *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChNodeFEAxyzDDD *)
             ((long)&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
                     super_ChNodeFEAbase._vptr_ChNodeFEAbase +
             (long)(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
                   super_ChNodeFEAbase._vptr_ChNodeFEAbase[-0x17]),in_RSI);
  return;
}

Assistant:

void ChNodeFEAxyzDDD::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAxyzDD>();
    // serialize parent class
    ChNodeFEAxyzDD::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(DDD);
    marchive << CHNVP(DDD_dt);
    marchive << CHNVP(DDD_dtdt);
}